

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io.c++
# Opt level: O0

void __thiscall kj::VectorOutputStream::grow(VectorOutputStream *this,size_t minSize)

{
  byte *pbVar1;
  uchar *puVar2;
  uchar *puVar3;
  uchar *puVar4;
  Array<unsigned_char> *other;
  undefined1 local_38 [8];
  Array<unsigned_char> newVector;
  size_t newSize;
  size_t minSize_local;
  VectorOutputStream *this_local;
  
  newVector.disposer = (ArrayDisposer *)Array<unsigned_char>::size(&this->vector);
  do {
    newVector.disposer = (ArrayDisposer *)((long)newVector.disposer << 1);
  } while (newVector.disposer < minSize);
  heapArray<unsigned_char>((Array<unsigned_char> *)local_38,(size_t)newVector.disposer);
  puVar2 = Array<unsigned_char>::begin((Array<unsigned_char> *)local_38);
  puVar3 = Array<unsigned_char>::begin(&this->vector);
  pbVar1 = this->fillPos;
  puVar4 = Array<unsigned_char>::begin(&this->vector);
  memcpy(puVar2,puVar3,(long)pbVar1 - (long)puVar4);
  pbVar1 = this->fillPos;
  puVar2 = Array<unsigned_char>::begin(&this->vector);
  puVar3 = Array<unsigned_char>::begin((Array<unsigned_char> *)local_38);
  this->fillPos = puVar3 + ((long)pbVar1 - (long)puVar2);
  other = mv<kj::Array<unsigned_char>>((Array<unsigned_char> *)local_38);
  Array<unsigned_char>::operator=(&this->vector,other);
  Array<unsigned_char>::~Array((Array<unsigned_char> *)local_38);
  return;
}

Assistant:

void VectorOutputStream::grow(size_t minSize) {
  size_t newSize = vector.size() * 2;
  while (newSize < minSize) newSize *= 2;
  auto newVector = heapArray<byte>(newSize);
  memcpy(newVector.begin(), vector.begin(), fillPos - vector.begin());
  fillPos = fillPos - vector.begin() + newVector.begin();
  vector = kj::mv(newVector);
}